

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::ctor<kj::_::ImmediatePromiseNode<kj::OwnFd>,kj::OwnFd>
               (ImmediatePromiseNode<kj::OwnFd> *location,OwnFd *params)

{
  ExceptionOr<kj::OwnFd> local_1a8;
  
  local_1a8.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1a8.value.ptr.isSet = true;
  local_1a8.value.ptr.field_1.value.fd = (OwnFd)params->fd;
  params->fd = -1;
  _::ImmediatePromiseNode<kj::OwnFd>::ImmediatePromiseNode(location,&local_1a8);
  _::ExceptionOr<kj::OwnFd>::~ExceptionOr(&local_1a8);
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}